

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

int linenoise::unicodeUTF8CharLen(char *buf,int buf_len,int pos)

{
  byte bVar1;
  uchar ch;
  int pos_local;
  int buf_len_local;
  char *buf_local;
  
  if (pos == buf_len) {
    buf_local._4_4_ = 0;
  }
  else {
    bVar1 = buf[pos];
    if (bVar1 < 0x80) {
      buf_local._4_4_ = 1;
    }
    else if (bVar1 < 0xe0) {
      buf_local._4_4_ = 2;
    }
    else if (bVar1 < 0xf0) {
      buf_local._4_4_ = 3;
    }
    else {
      buf_local._4_4_ = 4;
    }
  }
  return buf_local._4_4_;
}

Assistant:

inline int unicodeUTF8CharLen(char* buf, int buf_len, int pos)
{
    if (pos == buf_len) { return 0; }
    unsigned char ch = buf[pos];
    if (ch < 0x80) { return 1; }
    else if (ch < 0xE0) { return 2; }
    else if (ch < 0xF0) { return 3; }
    else { return 4; }
}